

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void QtPromisePrivate::PromiseDispatch<QtPromise::QPromise<int>>::
     call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>,tst_qpromise_finally::rejectedAsyncResolve()::__1>
               (QPromiseResolve<int> *resolve,QPromiseReject<int> *reject,anon_class_8_1_70098e60 fn
               )

{
  QSharedData *pQVar1;
  char cVar2;
  PromiseData<int> *this;
  QThread *p;
  QObject *pQVar3;
  QEvent *this_00;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_88;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_80;
  PromiseResolver<int> resolver;
  QPromiseBase<int> local_70;
  QWeakPointer<QObject> local_60;
  QPromiseReject<int> *local_50;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_48;
  QPromiseBase<int> local_40;
  
  local_70._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126a58;
  local_50 = reject;
  this = (PromiseData<int> *)operator_new(0x68);
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (this->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  PromiseData<int>::PromiseData(this);
  LOCK();
  pQVar1 = &(this->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(this->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_40._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126b90;
  local_70.m_d.d = this;
  local_40.m_d.d = this;
  PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_40);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_40);
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_80.d = (Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88 = resolver.m_d.d;
  local_48 = resolver.m_d.d;
  p = (QThread *)QThread::currentThread();
  QPointer<QThread>::QPointer((QPointer<QThread> *)&local_60,p);
  if (((local_60.d != (Data *)0x0) &&
      (local_60.value != (QObject *)0x0 && *(int *)(local_60.d + 4) != 0)) &&
     (cVar2 = QThread::isFinished(), cVar2 == '\0')) {
    if ((local_60.d == (Data *)0x0) || (*(int *)(local_60.d + 4) == 0)) {
      local_60.value = (QObject *)0x0;
    }
    pQVar3 = (QObject *)QAbstractEventDispatcher::instance((QThread *)local_60.value);
    if ((pQVar3 != (QObject *)0x0) || (cVar2 = QCoreApplication::closingDown(), cVar2 == '\0')) {
      this_00 = (QEvent *)operator_new(0x20);
      QEvent::QEvent(this_00,None);
      *(undefined ***)this_00 = &PTR__Event_001268f0;
      *(QVector<int> **)(this_00 + 0x10) = fn.values;
      *(Data **)(this_00 + 0x18) = local_88.d;
      if (local_88.d != (Data *)0x0) {
        LOCK();
        ((local_88.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_88.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QCoreApplication::postEvent(pQVar3,this_00,0);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_60);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_88);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_48);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_80);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_70._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00126b90;
  QList<int>::append(fn.values,8);
  PromiseFulfill<QtPromise::QPromise<int>>::
  call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((QPromise<int> *)&local_70,resolve,local_50);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_70);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }